

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmlite_init.c
# Opt level: O0

int CRYPTO_init(void)

{
  int iVar1;
  undefined4 local_4;
  
  iVar1 = CRYPTO_crit_enter();
  if (iVar1 == 0) {
    if (initialized == 0) {
      iVar1 = init_globals();
      if (iVar1 == 0) {
        abort();
      }
      _runtime_get_cpu_features();
      runtime_choose_best_implementation();
      initialized = 1;
      iVar1 = CRYPTO_crit_leave();
      if (iVar1 == 0) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      iVar1 = CRYPTO_crit_leave();
      if (iVar1 == 0) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CRYPTO_init()
{
    if (CRYPTO_crit_enter() != 0) 
        return GML_ERROR; /* LCOV_EXCL_LINE */

    if (initialized != 0) {
        if (CRYPTO_crit_leave() != 0) 
            return GML_ERROR; /* LCOV_EXCL_LINE */
        return GML_OK;
    }

    if (init_globals() == GML_ERROR) 
        abort();

    _runtime_get_cpu_features();

    runtime_choose_best_implementation();

    initialized = 1;
    if (CRYPTO_crit_leave() != 0)
        return GML_ERROR; /* LCOV_EXCL_LINE */

    return GML_OK;
}